

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InitTermTest.cpp
# Opt level: O3

int TestInit4SAX2(char *xmlFile,bool gDoNamespaces,bool gDoSchema,bool gSchemaFullChecking,
                 Teststate theState)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  InitTermTestErrorHandler errorHandler;
  XMLCh *doNamespaceFeature;
  XMLCh *fullSchemaCheckFeature;
  XMLCh *handleMultipleImportsFeature;
  XMLCh *doSchemaFeature;
  wchar16 *local_50;
  wchar16 *local_48;
  wchar16 *local_40;
  wchar16 *local_38;
  
  lVar2 = 1;
  lVar3 = lVar2;
  if (theState - Multiple < 4) {
    lVar2 = *(long *)(&DAT_00104468 + (ulong)(theState - Multiple) * 8);
    lVar3 = lVar2;
  }
  do {
    xercesc_4_0::XMLPlatformUtils::Initialize
              ((char *)&xercesc_4_0::XMLUni::fgXercescDefaultLocale,(char *)0x0,(PanicHandler *)0x0,
               (MemoryManager *)0x0);
    lVar2 = lVar2 + -1;
  } while (lVar2 != 0);
  if (theState == ExceedLimit) {
    xercesc_4_0::XMLPlatformUtils::Initialize
              ((char *)&xercesc_4_0::XMLUni::fgXercescDefaultLocale,(char *)0x0,(PanicHandler *)0x0,
               (MemoryManager *)0x0);
  }
  plVar1 = (long *)xercesc_4_0::XMLReaderFactory::createXMLReader
                             (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,(XMLGrammarPool *)0x0);
  local_50 = (wchar16 *)
             xercesc_4_0::XMLString::transcode
                       ("http://xml.org/sax/features/namespaces",
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  (**(code **)(*plVar1 + 0x60))(plVar1,local_50,gDoNamespaces);
  local_38 = (wchar16 *)
             xercesc_4_0::XMLString::transcode
                       ("http://apache.org/xml/features/validation/schema",
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  (**(code **)(*plVar1 + 0x60))(plVar1,local_38,gDoSchema);
  local_40 = (wchar16 *)
             xercesc_4_0::XMLString::transcode
                       ("http://apache.org/xml/features/validation/schema/handle-multiple-imports",
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  (**(code **)(*plVar1 + 0x60))(plVar1,local_40,1);
  local_48 = (wchar16 *)
             xercesc_4_0::XMLString::transcode
                       ("http://apache.org/xml/features/validation/schema-full-checking",
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  (**(code **)(*plVar1 + 0x60))(plVar1,local_48,gSchemaFullChecking);
  xercesc_4_0::XMLString::release(&local_50,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::release(&local_38,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::release(&local_40,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::release(&local_48,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  (**(code **)(*plVar1 + 0x58))(plVar1);
  (**(code **)(*plVar1 + 0x80))(plVar1,xmlFile);
  (**(code **)(*plVar1 + 8))(plVar1);
  do {
    xercesc_4_0::XMLPlatformUtils::Terminate();
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  if ((theState == ExceedLimit) || (theState == UnEven)) {
    xercesc_4_0::XMLPlatformUtils::Terminate();
  }
  return 0;
}

Assistant:

int TestInit4SAX2(const char* xmlFile, bool gDoNamespaces, bool gDoSchema, bool gSchemaFullChecking, Teststate theState)
{
    TESTINITPRE;
    SAX2XMLReader* parser = XMLReaderFactory::createXMLReader();

    XMLCh* doNamespaceFeature = XMLString::transcode("http://xml.org/sax/features/namespaces");
    parser->setFeature(doNamespaceFeature, gDoNamespaces);

    XMLCh* doSchemaFeature = XMLString::transcode("http://apache.org/xml/features/validation/schema");
    parser->setFeature(doSchemaFeature, gDoSchema);

    XMLCh* handleMultipleImportsFeature = XMLString::transcode("http://apache.org/xml/features/validation/schema/handle-multiple-imports");
    parser->setFeature(handleMultipleImportsFeature, true);

    XMLCh* fullSchemaCheckFeature = XMLString::transcode("http://apache.org/xml/features/validation/schema-full-checking");
    parser->setFeature(fullSchemaCheckFeature, gSchemaFullChecking);

    XMLString::release(&doNamespaceFeature);
    XMLString::release(&doSchemaFeature);
    XMLString::release(&handleMultipleImportsFeature);
    XMLString::release(&fullSchemaCheckFeature);

    TESTINITPOST;
}